

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

InterfaceText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeInterfaceText
          (InterfaceText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          InterfaceSchema schema,Array<kj::StringTree> nestedTypeDecls,
          TemplateContext *templateContext)

{
  bool *pbVar1;
  undefined8 *puVar2;
  ArrayDisposer *pAVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  Branch *pBVar6;
  size_t sVar7;
  size_t sVar8;
  Branch *pBVar9;
  size_t sVar10;
  Branch *pBVar11;
  Method method;
  StringPtr hexId_00;
  ArrayDisposer *pAVar12;
  Branch *pBVar13;
  undefined8 uVar14;
  RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *pRVar15;
  bool bVar16;
  int iVar17;
  ExtendInfo *firstElement;
  size_t sVar18;
  ExtendInfo *firstElement_00;
  uint64_t uVar19;
  _Rb_tree_node_base *p_Var20;
  ExtendInfo *pEVar21;
  Schema params_1;
  ExtendInfo *pEVar22;
  ExtendInfo *pEVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *params_1_00;
  char *pcVar25;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *extraout_RDX;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *extraout_RDX_00;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map;
  size_t *psVar26;
  CppTypeName *value_00;
  ElementCount index;
  unsigned_long uVar27;
  StringTree *pSVar28;
  BrandInitializerText *method_00;
  BrandInitializerText *pBVar29;
  char (*pacVar30) [9];
  char (*pacVar31) [9];
  code *brandInitializers_00;
  ExtendInfo *pEVar32;
  long lVar33;
  size_t sVar34;
  uint index_00;
  long lVar35;
  long lVar36;
  size_t sVar37;
  TemplateContext *templateContext_00;
  long lVar38;
  StringPtr suffix;
  StringPtr interfaceName;
  StringPtr delim;
  StringPtr delim_00;
  StringPtr delim_01;
  StringPtr delim_02;
  StringPtr delim_03;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  pVar39;
  StringPtr innerName;
  StringPtr type;
  StringPtr fullName_00;
  StringPtr suffix_00;
  StringPtr suffix_01;
  char (*params_11) [26];
  ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> builder;
  Branch *local_a58;
  size_t sStack_a50;
  ArrayDisposer *local_a48;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> result_2;
  Branch *local_a18;
  ExtendInfo *pEStack_a10;
  ArrayDisposer *local_a08;
  InterfaceSchema schema_local;
  String fullName;
  BrandInitializerText brandInitializers;
  Branch *local_908;
  size_t sStack_900;
  ArrayDisposer *local_8f8;
  Branch *local_8f0;
  uint64_t uStack_8e8;
  ArrayDisposer *local_8e0;
  char *local_8d8;
  char *local_8d0;
  ArrayDisposer *pAStack_8c8;
  Branch *local_8c0;
  Branch *local_8b8;
  ArrayDisposer *pAStack_8b0;
  ArrayDisposer *local_8a8;
  CppTypeName typeName;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> methods;
  String result_3;
  ArrayDisposer *local_820;
  Branch *local_818;
  size_t sStack_810;
  ArrayDisposer *local_808;
  StringTree declareText;
  StringPtr name_local;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> transitiveSuperclasses;
  Array<kj::StringTree> result_11;
  Array<kj::StringTree> result_10;
  CppTypeName clientName;
  ArrayBuilder<kj::StringTree> builder_3;
  String local_6f8;
  StringTree defineText;
  Array<kj::StringTree> result_9;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> superclasses;
  Array<kj::StringTree> result_12;
  Array<kj::StringTree> result_8;
  Array<kj::StringTree> result_7;
  Array<kj::StringTree> result_6;
  Array<kj::StringTree> result_5;
  StringPtr scope_local;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [24];
  CppTypeName *local_590;
  undefined1 local_588 [24];
  ArrayDisposer *local_570;
  undefined1 local_568 [16];
  undefined1 local_558 [24];
  ArrayDisposer *local_540;
  Reader proto;
  StringTree local_508;
  StringTree local_4c8;
  StringTree local_488;
  long local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  Array<kj::StringTree> result_4;
  String templates;
  undefined1 local_3e0 [8];
  ArrayDisposer *local_3d8;
  char *local_3c0;
  String local_3b8;
  ArrayDisposer *pAStack_3a0;
  ArrayPtr<const_char> local_398;
  ArrayPtr<const_char> local_388;
  undefined1 local_378 [24];
  size_t local_360;
  ArrayPtr<const_char> local_358;
  ArrayPtr<const_char> local_348;
  undefined1 local_338 [24];
  undefined8 local_320;
  ArrayPtr<const_char> local_318;
  StringTree local_308;
  StringTree local_2d0;
  StringTree local_298;
  StringTree local_260;
  StringTree local_228;
  StringTree local_1f0;
  StringTree local_1b8;
  StringTree local_180;
  StringTree local_148;
  CappedArray<char,_17UL> hexId;
  undefined1 local_f0 [24];
  ArrayDisposer *pAStack_d8;
  Branch *local_d0;
  ArrayDisposer *pAStack_c8;
  Branch *local_c0;
  size_t sStack_b8;
  ArrayDisposer *local_b0;
  size_t sStack_a8;
  char *local_a0;
  size_t local_98;
  ArrayDisposer *local_90;
  Branch *local_88;
  size_t local_80;
  ArrayDisposer *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  ArrayDisposer *local_58;
  Branch *local_50;
  size_t local_48;
  ArrayDisposer *local_40;
  size_t local_38;
  CppTypeName *value;
  
  pBVar13 = local_818;
  pEVar23 = pEStack_a10;
  pBVar11 = local_a18;
  name_local.content.size_ = name.content.size_;
  pSVar28 = (StringTree *)name.content.ptr;
  scope_local.content.size_ = scope.content.size_;
  scope_local.content.ptr = scope.content.ptr;
  schema_local = schema;
  suffix.content.size_ = 1;
  suffix.content.ptr = "";
  name_local.content.ptr = (char *)pSVar28;
  TemplateContext::args(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_,suffix);
  typeName.name.text.content.ptr = (char *)(scope_local.content.size_ - 1);
  typeName.name.size_ = (size_t)scope_local.content.ptr;
  clientName.name.text.content.ptr = (char *)(name_local.content.size_ - 1);
  clientName.name.size_ = (size_t)name_local.content.ptr;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (&fullName,(_ *)&typeName,(ArrayPtr<const_char> *)&clientName,
             (ArrayPtr<const_char> *)&brandInitializers,pSVar28);
  sVar18 = brandInitializers.scopes.branches.size_;
  pBVar6 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar6,0x40,sVar18,sVar18,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar18 = brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar18,sVar18,0);
  }
  InterfaceSchema::getMethods((MethodList *)&builder,&schema_local);
  clientName.name.branches.ptr = local_a58;
  clientName.name.text.content.size_ = (size_t)builder.endPtr;
  clientName.name.text.content.disposer = builder.disposer;
  clientName.name.size_ = (size_t)builder.ptr;
  clientName.name.text.content.ptr = (char *)builder.pos;
  firstElement = (ExtendInfo *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x118,0,(ulong)local_a58 & 0xffffffff,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
  result_2.disposer =
       (ArrayDisposer *)(((ulong)local_a58 & 0xffffffff) * 0x118 + (long)firstElement);
  pEVar32 = firstElement;
  result_2.ptr = firstElement;
  result_2.size_ = (size_t)firstElement;
  if ((ElementCount)clientName.name.branches.ptr != 0) {
    index = 0;
    do {
      sVar18 = clientName.name.size_;
      _::ListReader::getStructElement
                ((StructReader *)&typeName.name.text.content.size_,
                 (ListReader *)&clientName.name.text,index);
      typeName.name.size_ = sVar18;
      typeName.name.text.content.ptr =
           (char *)CONCAT62(typeName.name.text.content.ptr._2_6_,(short)index);
      pcVar25 = "";
      if (fullName.content.size_ != 0) {
        pcVar25 = fullName.content.ptr;
      }
      interfaceName.content.size_ = fullName.content.size_ + (fullName.content.size_ == 0);
      method.proto._reader._44_4_ = typeName._60_4_;
      method.proto._reader.nestingLimit._0_1_ = typeName.isArgDependent;
      method.proto._reader.nestingLimit._1_1_ = typeName.needsTypename;
      method.proto._reader.nestingLimit._2_1_ = typeName.hasInterfaces_;
      method.proto._reader.nestingLimit._3_1_ = typeName.hasDisambiguatedTemplate_;
      method._8_8_ = typeName.name.text.content.ptr;
      method.parent.super_Schema.raw = (Schema)(Schema)sVar18;
      method.proto._reader.segment = (SegmentReader *)typeName.name.text.content.size_;
      method.proto._reader.capTable = (CapTableReader *)typeName.name.text.content.disposer;
      method.proto._reader.data = typeName.name.branches.ptr;
      method.proto._reader.pointers = (WirePointer *)typeName.name.branches.size_;
      method.proto._reader._32_8_ = typeName.name.branches.disposer;
      interfaceName.content.ptr = pcVar25;
      makeMethodText((MethodText *)&brandInitializers,this,interfaceName,method,
                     (TemplateContext *)nestedTypeDecls.size_);
      (pEVar32->typeName).name.size_ = brandInitializers.scopes.size_;
      (pEVar32->typeName).name.text.content.ptr = brandInitializers.scopes.text.content.ptr;
      (pEVar32->typeName).name.text.content.size_ = brandInitializers.scopes.text.content.size_;
      (pEVar32->typeName).name.text.content.disposer =
           brandInitializers.scopes.text.content.disposer;
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      (pEVar32->typeName).name.branches.ptr = brandInitializers.scopes.branches.ptr;
      (pEVar32->typeName).name.branches.size_ = brandInitializers.scopes.branches.size_;
      (pEVar32->typeName).name.branches.disposer = brandInitializers.scopes.branches.disposer;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      (pEVar32->typeName).isArgDependent = (bool)(undefined1)brandInitializers.bindings.size_;
      (pEVar32->typeName).needsTypename = (bool)brandInitializers.bindings.size_._1_1_;
      (pEVar32->typeName).hasInterfaces_ = (bool)brandInitializers.bindings.size_._2_1_;
      (pEVar32->typeName).hasDisambiguatedTemplate_ = (bool)brandInitializers.bindings.size_._3_1_;
      *(undefined4 *)&(pEVar32->typeName).field_0x3c = brandInitializers.bindings.size_._4_4_;
      pEVar32->id = (uint64_t)brandInitializers.bindings.text.content.ptr;
      pEVar32[1].typeName.name.size_ = brandInitializers.bindings.text.content.size_;
      pEVar32[1].typeName.name.text.content.ptr =
           (char *)brandInitializers.bindings.text.content.disposer;
      brandInitializers.bindings.text.content.ptr = (char *)0x0;
      brandInitializers.bindings.text.content.size_ = 0;
      pEVar32[1].typeName.name.text.content.size_ = (size_t)brandInitializers.bindings.branches.ptr;
      pEVar32[1].typeName.name.text.content.disposer =
           (ArrayDisposer *)brandInitializers.bindings.branches.size_;
      pEVar32[1].typeName.name.branches.ptr = (Branch *)brandInitializers.bindings.branches.disposer
      ;
      brandInitializers.bindings.branches.ptr = (Branch *)0x0;
      brandInitializers.bindings.branches.size_ = 0;
      pEVar32[1].typeName.name.branches.size_ = brandInitializers.dependencies.size_;
      pEVar32[1].typeName.name.branches.disposer =
           (ArrayDisposer *)brandInitializers.dependencies.text.content.ptr;
      pEVar32[1].typeName.isArgDependent =
           (bool)(undefined1)brandInitializers.dependencies.text.content.size_;
      pEVar32[1].typeName.needsTypename =
           (bool)brandInitializers.dependencies.text.content.size_._1_1_;
      pEVar32[1].typeName.hasInterfaces_ =
           (bool)brandInitializers.dependencies.text.content.size_._2_1_;
      pEVar32[1].typeName.hasDisambiguatedTemplate_ =
           (bool)brandInitializers.dependencies.text.content.size_._3_1_;
      *(undefined4 *)&pEVar32[1].typeName.field_0x3c =
           brandInitializers.dependencies.text.content.size_._4_4_;
      pEVar32[1].id = (uint64_t)brandInitializers.dependencies.text.content.disposer;
      brandInitializers.dependencies.text.content.ptr = (char *)0x0;
      brandInitializers.dependencies.text.content.size_ = 0;
      pEVar32[2].typeName.name.size_ = (size_t)brandInitializers.dependencies.branches.ptr;
      pEVar32[2].typeName.name.text.content.ptr =
           (char *)brandInitializers.dependencies.branches.size_;
      pEVar32[2].typeName.name.text.content.size_ =
           (size_t)brandInitializers.dependencies.branches.disposer;
      brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
      brandInitializers.dependencies.branches.size_ = 0;
      pEVar32[2].typeName.name.text.content.disposer =
           (ArrayDisposer *)brandInitializers.dependencyCount;
      pEVar32[2].typeName.name.branches.ptr = local_908;
      pEVar32[2].typeName.name.branches.size_ = sStack_900;
      pEVar32[2].typeName.name.branches.disposer = local_8f8;
      local_908 = (Branch *)0x0;
      sStack_900 = 0;
      *(Branch **)&pEVar32[2].typeName.isArgDependent = local_8f0;
      pEVar32[2].id = uStack_8e8;
      pEVar32[3].typeName.name.size_ = (size_t)local_8e0;
      local_8f0 = (Branch *)0x0;
      uStack_8e8 = 0;
      pEVar32[3].typeName.name.text.content.ptr = local_8d8;
      pEVar32[3].typeName.name.text.content.size_ = (size_t)local_8d0;
      pEVar32[3].typeName.name.text.content.disposer = pAStack_8c8;
      pEVar32[3].typeName.name.branches.ptr = local_8c0;
      local_8d0 = (char *)0x0;
      pAStack_8c8 = (ArrayDisposer *)0x0;
      pEVar32[3].typeName.name.branches.size_ = (size_t)local_8b8;
      pEVar32[3].typeName.name.branches.disposer = pAStack_8b0;
      *(ArrayDisposer **)&pEVar32[3].typeName.isArgDependent = local_8a8;
      local_8b8 = (Branch *)0x0;
      pAStack_8b0 = (ArrayDisposer *)0x0;
      pEVar32 = (ExtendInfo *)&pEVar32[3].id;
      MethodText::~MethodText((MethodText *)&brandInitializers);
      index = index + 1;
    } while (index != (ElementCount)clientName.name.branches.ptr);
  }
  lVar35 = (long)pEVar32 - (long)firstElement >> 3;
  sVar18 = lVar35 * -0x5075075075075075;
  Schema::getProto(&proto,&schema_local.super_Schema);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex(&hexId,uVar27);
  InterfaceSchema::getSuperclasses((SuperclassList *)&builder,&schema_local);
  clientName.name.branches.disposer = local_a48;
  clientName.name.branches.ptr = local_a58;
  clientName.name.size_ = (size_t)builder.ptr;
  clientName.name.text.content.ptr = (char *)builder.pos;
  firstElement_00 =
       (ExtendInfo *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x48,0,(ulong)local_a58 & 0xffffffff,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr *)0x0);
  result_2.disposer = (ArrayDisposer *)(firstElement_00 + ((ulong)local_a58 & 0xffffffff));
  map = extraout_RDX;
  pEVar32 = firstElement_00;
  result_2.ptr = firstElement_00;
  result_2.size_ = (size_t)firstElement_00;
  if ((ElementCount)clientName.name.branches.ptr != 0) {
    index_00 = 0;
    pcVar25 = typeName.name.text.content.ptr;
    sVar34 = typeName.name.text.content.size_;
    pBVar6 = typeName.name.branches.ptr;
    sVar37 = typeName.name.branches.size_;
    do {
      typeName.name.branches.size_ = sVar37;
      typeName.name.branches.ptr = pBVar6;
      typeName.name.text.content.size_ = sVar34;
      typeName.name.text.content.ptr = pcVar25;
      result_3.content.ptr =
           (char *)InterfaceSchema::SuperclassList::operator[]
                             ((SuperclassList *)&clientName,index_00);
      brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
      cppFullName(&typeName,this,(Schema)result_3.content.ptr,(Schema)result_3.content.ptr,
                  (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
      Schema::getProto((Reader *)&brandInitializers,(Schema *)&result_3);
      if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(uint64_t *)brandInitializers.scopes.text.content.size_;
      }
      (pEVar32->typeName).name.size_ = typeName.name.size_;
      (pEVar32->typeName).name.text.content.ptr = typeName.name.text.content.ptr;
      (pEVar32->typeName).name.text.content.size_ = typeName.name.text.content.size_;
      (pEVar32->typeName).name.text.content.disposer = typeName.name.text.content.disposer;
      (pEVar32->typeName).name.branches.ptr = typeName.name.branches.ptr;
      (pEVar32->typeName).name.branches.size_ = typeName.name.branches.size_;
      (pEVar32->typeName).name.branches.disposer = typeName.name.branches.disposer;
      (pEVar32->typeName).isArgDependent = typeName.isArgDependent;
      (pEVar32->typeName).needsTypename = typeName.needsTypename;
      (pEVar32->typeName).hasInterfaces_ = typeName.hasInterfaces_;
      (pEVar32->typeName).hasDisambiguatedTemplate_ = typeName.hasDisambiguatedTemplate_;
      pEVar32->id = uVar19;
      pEVar32 = pEVar32 + 1;
      typeName.name.branches.size_ = 0;
      sVar37 = typeName.name.branches.size_;
      typeName.name.branches.ptr = (Branch *)0x0;
      pBVar6 = typeName.name.branches.ptr;
      typeName.name.text.content.size_ = 0;
      sVar34 = typeName.name.text.content.size_;
      typeName.name.text.content.ptr = (char *)0x0;
      pcVar25 = typeName.name.text.content.ptr;
      typeName.name.branches.size_ = 0;
      typeName.name.branches.ptr = (Branch *)0x0;
      typeName.name.text.content.size_ = 0;
      typeName.name.text.content.ptr = (char *)0x0;
      index_00 = index_00 + 1;
      map = extraout_RDX_00;
    } while (index_00 != (ElementCount)clientName.name.branches.ptr);
  }
  lVar33 = (long)pEVar32 - (long)firstElement_00 >> 3;
  sVar34 = lVar33 * -0x71c71c71c71c71c7;
  clientName.name.text.content.disposer = (ArrayDisposer *)&clientName.name.text;
  clientName.name.text.content.ptr =
       (char *)((ulong)clientName.name.text.content.ptr & 0xffffffff00000000);
  clientName.name.text.content.size_ = 0;
  clientName.name.branches.size_ = 0;
  clientName.name.branches.ptr = (Branch *)clientName.name.text.content.disposer;
  getTransitiveSuperclasses
            ((CapnpcCppMain *)schema_local.super_Schema.raw,(InterfaceSchema)&clientName,map);
  Schema::getProto((Reader *)&brandInitializers,&schema_local.super_Schema);
  if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
    typeName.name.size_ = 0;
  }
  else {
    typeName.name.size_ = *(size_t *)brandInitializers.scopes.text.content.size_;
  }
  pVar39 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
                          *)&clientName,(key_type *)&typeName);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
                  *)&clientName,(_Base_ptr)pVar39.first._M_node,(_Base_ptr)pVar39.second._M_node);
  sVar37 = clientName.name.branches.size_;
  builder.ptr = (ExtendInfo *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x48,0,clientName.name.branches.size_,(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
  builder.endPtr = builder.ptr + sVar37;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder.pos = builder.ptr;
  if ((String *)clientName.name.text.content.disposer != &clientName.name.text) {
    p_Var20 = (_Rb_tree_node_base *)clientName.name.text.content.disposer;
    do {
      brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
      cppFullName(&typeName,this,(RawBrandedSchema *)p_Var20[1]._M_parent,
                  (RawBrandedSchema *)p_Var20[1]._M_parent,
                  (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
      Schema::getProto((Reader *)&brandInitializers,(Schema *)&p_Var20[1]._M_parent);
      if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(uint64_t *)brandInitializers.scopes.text.content.size_;
      }
      ((builder.pos)->typeName).name.size_ = typeName.name.size_;
      ((builder.pos)->typeName).name.text.content.ptr = typeName.name.text.content.ptr;
      ((builder.pos)->typeName).name.text.content.size_ = typeName.name.text.content.size_;
      ((builder.pos)->typeName).name.text.content.disposer = typeName.name.text.content.disposer;
      ((builder.pos)->typeName).name.branches.ptr = typeName.name.branches.ptr;
      ((builder.pos)->typeName).name.branches.size_ = typeName.name.branches.size_;
      ((builder.pos)->typeName).name.branches.disposer = typeName.name.branches.disposer;
      ((builder.pos)->typeName).isArgDependent = typeName.isArgDependent;
      ((builder.pos)->typeName).needsTypename = typeName.needsTypename;
      ((builder.pos)->typeName).hasInterfaces_ = typeName.hasInterfaces_;
      ((builder.pos)->typeName).hasDisambiguatedTemplate_ = typeName.hasDisambiguatedTemplate_;
      (builder.pos)->id = uVar19;
      builder.pos = builder.pos + 1;
      typeName.name.branches.size_ = 0;
      typeName.name.branches.ptr = (Branch *)0x0;
      typeName.name.text.content.size_ = 0;
      typeName.name.text.content.ptr = (char *)0x0;
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (p_Var20 != (_Rb_tree_node_base *)&clientName.name.text);
  }
  pAVar12 = builder.disposer;
  pEVar32 = builder.ptr;
  lVar36 = (long)builder.pos - (long)builder.ptr >> 3;
  sVar37 = lVar36 * -0x71c71c71c71c71c7;
  result_2.disposer = builder.disposer;
  result_2.ptr = builder.ptr;
  result_2.size_ = sVar37;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
               *)&clientName);
  method_00 = &brandInitializers;
  brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
  cppFullName(&typeName,this,schema_local.super_Schema.raw,schema_local.super_Schema.raw,
              (Maybe<capnp::InterfaceSchema::Method> *)method_00);
  CppTypeName::CppTypeName(&clientName,&typeName);
  innerName.content.size_ = 7;
  innerName.content.ptr = "Client";
  CppTypeName::addMemberType(&clientName,innerName);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  brandInitializers_00 = (code *)&templates;
  kj::_::concat<kj::StringTree>((String *)brandInitializers_00,&brandInitializers.scopes);
  pBVar29 = (BrandInitializerText *)brandInitializers.scopes.branches.size_;
  pBVar6 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar6,0x40,pBVar29,pBVar29,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    method_00 = pBVar29;
  }
  pBVar29 = (BrandInitializerText *)brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,pBVar29,pBVar29,0);
    method_00 = pBVar29;
  }
  params_11 = (char (*) [26])0x16a153;
  kj::strTree<char_const(&)[79],kj::CappedArray<char,17ul>&,char_const(&)[3]>
            (&declareText,
             (kj *)
             "  #if !CAPNP_LITE\n  struct _capnpPrivate {\n    CAPNP_DECLARE_INTERFACE_HEADER(",
             (char (*) [79])&hexId,(CappedArray<char,_17UL> *)")\n",(char (*) [3])method_00);
  pEVar21 = (ExtendInfo *)0x22a50e;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],char_const(&)[17],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x22a50e,
             (char (*) [2])0x229c8c,(char (*) [17])brandInitializers_00,
             (String *)"constexpr ::capnp::Kind ",(char (*) [25])&fullName,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])brandInitializers_00,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])&fullName,
             (String *)"::_capnpPrivate::schema;\n",params_11);
  if ((*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) ||
     ((*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0)) {
    builder.ptr = (ExtendInfo *)anon_var_dwarf_82acd;
    builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x63;
    kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,&declareText,(StringTree *)&builder,
               (ArrayPtr<const_char> *)pEVar21);
    pEVar23 = (ExtendInfo *)declareText.text.content.size_;
    pcVar25 = declareText.text.content.ptr;
    declareText.size_ = brandInitializers.scopes.size_;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(declareText.text.content.disposer._4_4_,
                           declareText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(declareText.text.content.disposer._4_4_,
                          declareText.text.content.disposer._0_4_),pcVar25,1,pEVar23,pEVar23,0);
      pEVar21 = pEVar23;
    }
    pEVar23 = (ExtendInfo *)declareText.branches.size_;
    pBVar11 = declareText.branches.ptr;
    declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
    declareText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
    declareText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar11,0x40,pEVar23,pEVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pEVar21 = pEVar23;
    }
    pEVar23 = (ExtendInfo *)brandInitializers.scopes.text.content.size_;
    pcVar25 = brandInitializers.scopes.text.content.ptr;
    declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
    declareText.branches.size_ = brandInitializers.scopes.branches.size_;
    declareText.branches.disposer = brandInitializers.scopes.branches.disposer;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                (brandInitializers.scopes.text.content.disposer,pcVar25,1,pEVar23,pEVar23,0);
      pEVar21 = pEVar23;
    }
  }
  else {
    params_1 = schema_local.super_Schema.raw;
    makeBrandInitializers
              (&brandInitializers,this,(TemplateContext *)nestedTypeDecls.size_,
               schema_local.super_Schema.raw);
    makeGenericDeclarations
              ((StringTree *)&result_2,(CapnpcCppMain *)nestedTypeDecls.size_,
               (TemplateContext *)(ulong)(brandInitializers.dependencies.size_ != 0),
               SUB81(params_1.raw,0));
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              ((StringTree *)&builder,&declareText,(StringTree *)&result_2,
               (StringTree *)params_1.raw);
    sVar4 = declareText.text.content.size_;
    pcVar25 = declareText.text.content.ptr;
    declareText.size_ = (size_t)builder.ptr;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(declareText.text.content.disposer._4_4_,
                           declareText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(declareText.text.content.disposer._4_4_,
                          declareText.text.content.disposer._0_4_),pcVar25,1,sVar4,sVar4);
    }
    sVar4 = declareText.branches.size_;
    pBVar6 = declareText.branches.ptr;
    declareText.text.content.ptr = (char *)builder.pos;
    declareText.text.content.size_ = (size_t)builder.endPtr;
    declareText.text.content.disposer._0_4_ = builder.disposer._0_4_;
    declareText.text.content.disposer._4_4_ = builder.disposer._4_4_;
    builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
    builder.endPtr = (ExtendInfo *)0x0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar6,0x40,sVar4,sVar4);
    }
    pEVar21 = builder.endPtr;
    pRVar15 = builder.pos;
    declareText.branches.ptr = local_a58;
    declareText.branches.size_ = sStack_a50;
    declareText.branches.disposer = local_a48;
    if (builder.pos != (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0)
    {
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      builder.endPtr = (ExtendInfo *)0x0;
      brandInitializers_00 = (code *)0x0;
      (**(builder.disposer)->_vptr_ArrayDisposer)(builder.disposer,pRVar15,1,pEVar21,pEVar21);
    }
    if (local_a18 != (Branch *)0x0) {
      local_a18 = (Branch *)0x0;
      pEStack_a10 = (ExtendInfo *)0x0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**local_a08->_vptr_ArrayDisposer)(local_a08,pBVar11,0x40,pEVar23,pEVar23);
    }
    pEVar23 = pEStack_a10;
    pBVar11 = local_a18;
    pAVar3 = result_2.disposer;
    sVar4 = result_2.size_;
    if (result_2.size_ != 0) {
      result_2.size_ = 0;
      result_2.disposer = (ArrayDisposer *)0x0;
      brandInitializers_00 = (code *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,(void *)sVar4,1,
                 (size_t)pAVar3,(size_t)pAVar3,(_func_void_void_ptr *)0x0);
    }
    templateContext_00 = (TemplateContext *)fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      templateContext_00 = (TemplateContext *)0x22a50f;
    }
    pEVar21 = (ExtendInfo *)(fullName.content.size_ + (fullName.content.size_ == 0));
    kj::heapString(&result_3,hexId.currentSize);
    if (hexId.currentSize != 0) {
      pcVar25 = (char *)result_3.content.size_;
      if (result_3.content.size_ != 0) {
        pcVar25 = result_3.content.ptr;
      }
      memcpy(pcVar25,hexId.content,hexId.currentSize);
    }
    local_3b8.content.disposer = (ArrayDisposer *)result_3.content.ptr;
    if (result_3.content.size_ == 0) {
      local_3b8.content.disposer = (ArrayDisposer *)0x22a50f;
    }
    pAStack_3a0 = (ArrayDisposer *)(result_3.content.size_ + (result_3.content.size_ == 0));
    local_f0._16_8_ = brandInitializers.scopes.size_;
    pAStack_d8 = (ArrayDisposer *)brandInitializers.scopes.text.content.ptr;
    local_d0 = (Branch *)brandInitializers.scopes.text.content.size_;
    pAStack_c8 = brandInitializers.scopes.text.content.disposer;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    local_c0 = brandInitializers.scopes.branches.ptr;
    sStack_b8 = brandInitializers.scopes.branches.size_;
    local_b0 = brandInitializers.scopes.branches.disposer;
    sStack_a8 = brandInitializers.bindings.size_;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    local_a0 = brandInitializers.bindings.text.content.ptr;
    local_98 = brandInitializers.bindings.text.content.size_;
    local_90 = brandInitializers.bindings.text.content.disposer;
    brandInitializers.bindings.text.content.ptr = (char *)0x0;
    brandInitializers.bindings.text.content.size_ = 0;
    local_88 = brandInitializers.bindings.branches.ptr;
    local_80 = brandInitializers.bindings.branches.size_;
    local_78 = brandInitializers.bindings.branches.disposer;
    brandInitializers.bindings.branches.ptr = (Branch *)0x0;
    brandInitializers.bindings.branches.size_ = 0;
    local_70 = brandInitializers.dependencies.size_;
    local_68 = brandInitializers.dependencies.text.content.ptr;
    local_60 = brandInitializers.dependencies.text.content.size_;
    local_58 = brandInitializers.dependencies.text.content.disposer;
    brandInitializers.dependencies.text.content.ptr = (char *)0x0;
    brandInitializers.dependencies.text.content.size_ = 0;
    local_50 = brandInitializers.dependencies.branches.ptr;
    local_48 = brandInitializers.dependencies.branches.size_;
    local_40 = brandInitializers.dependencies.branches.disposer;
    brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
    brandInitializers.dependencies.branches.size_ = 0;
    local_38 = brandInitializers.dependencyCount;
    hexId_00.content.size_ = (size_t)pAStack_3a0;
    hexId_00.content.ptr = (char *)local_3b8.content.disposer;
    fullName_00.content.size_ = (size_t)(local_f0 + 0x10);
    fullName_00.content.ptr = (char *)pEVar21;
    makeGenericDefinitions
              ((StringTree *)&result_2,(CapnpcCppMain *)nestedTypeDecls.size_,templateContext_00,
               fullName_00,hexId_00,(BrandInitializerText *)brandInitializers_00);
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              ((StringTree *)&builder,&defineText,(StringTree *)&result_2,(StringTree *)pEVar21);
    pEVar22 = (ExtendInfo *)defineText.text.content.size_;
    pcVar25 = defineText.text.content.ptr;
    defineText.size_ = (size_t)builder.ptr;
    if (defineText.text.content.ptr != (char *)0x0) {
      defineText.text.content.ptr = (char *)0x0;
      defineText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(defineText.text.content.disposer._4_4_,
                           defineText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(defineText.text.content.disposer._4_4_,
                          defineText.text.content.disposer._0_4_),pcVar25,1,pEVar22,pEVar22);
      pEVar21 = pEVar22;
    }
    pEVar22 = (ExtendInfo *)defineText.branches.size_;
    pBVar6 = defineText.branches.ptr;
    defineText.text.content.ptr = (char *)builder.pos;
    defineText.text.content.size_ = (size_t)builder.endPtr;
    defineText.text.content.disposer._0_4_ = builder.disposer._0_4_;
    defineText.text.content.disposer._4_4_ = builder.disposer._4_4_;
    builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
    builder.endPtr = (ExtendInfo *)0x0;
    if (defineText.branches.ptr != (Branch *)0x0) {
      defineText.branches.ptr = (Branch *)0x0;
      defineText.branches.size_ = 0;
      (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                (defineText.branches.disposer,pBVar6,0x40,pEVar22,pEVar22);
      pEVar21 = pEVar22;
    }
    pEVar22 = builder.endPtr;
    pRVar15 = builder.pos;
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    defineText.branches.disposer = local_a48;
    local_a58 = (Branch *)0x0;
    sStack_a50 = 0;
    if (builder.pos != (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0)
    {
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      builder.endPtr = (ExtendInfo *)0x0;
      (**(builder.disposer)->_vptr_ArrayDisposer)(builder.disposer,pRVar15,1,pEVar22,pEVar22);
      pEVar21 = pEVar22;
    }
    if (local_a18 != (Branch *)0x0) {
      local_a18 = (Branch *)0x0;
      pEStack_a10 = (ExtendInfo *)0x0;
      (**local_a08->_vptr_ArrayDisposer)(local_a08,pBVar11,0x40,pEVar23,pEVar23);
      pEVar21 = pEVar23;
    }
    pEVar23 = (ExtendInfo *)result_2.disposer;
    sVar4 = result_2.size_;
    if (result_2.size_ != 0) {
      result_2.size_ = 0;
      result_2.disposer = (ArrayDisposer *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,(void *)sVar4,1,
                 (size_t)pEVar23,(size_t)pEVar23,(_func_void_void_ptr *)0x0);
      pEVar21 = pEVar23;
    }
    BrandInitializerText::~BrandInitializerText((BrandInitializerText *)(local_f0 + 0x10));
    pEVar23 = (ExtendInfo *)result_3.content.size_;
    pcVar25 = result_3.content.ptr;
    if (result_3.content.ptr != (char *)0x0) {
      result_3.content.ptr = (char *)0x0;
      result_3.content.size_ = 0;
      (**(result_3.content.disposer)->_vptr_ArrayDisposer)
                (result_3.content.disposer,pcVar25,1,pEVar23,pEVar23,0);
      pEVar21 = pEVar23;
    }
    BrandInitializerText::~BrandInitializerText(&brandInitializers);
  }
  pBVar11 = local_a18;
  builder.ptr = (ExtendInfo *)anon_var_dwarf_82ae5;
  builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x1d;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&declareText,(StringTree *)&builder,
             (ArrayPtr<const_char> *)pEVar21);
  pAVar24 = (ArrayPtr<const_char> *)declareText.text.content.size_;
  pcVar25 = declareText.text.content.ptr;
  declareText.size_ = brandInitializers.scopes.size_;
  params_1_00 = (ArrayPtr<const_char> *)&declareText.text;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(declareText.text.content.disposer._4_4_,
                         declareText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(declareText.text.content.disposer._4_4_,
                        declareText.text.content.disposer._0_4_),pcVar25,1,pAVar24,pAVar24,0);
    params_1_00 = pAVar24;
  }
  pAVar24 = (ArrayPtr<const_char> *)declareText.branches.size_;
  pBVar6 = declareText.branches.ptr;
  declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  declareText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
  declareText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar6,0x40,pAVar24,pAVar24,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    params_1_00 = pAVar24;
  }
  pAVar24 = (ArrayPtr<const_char> *)brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
  declareText.branches.size_ = brandInitializers.scopes.branches.size_;
  declareText.branches.disposer = brandInitializers.scopes.branches.disposer;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,pAVar24,pAVar24,0);
    params_1_00 = pAVar24;
  }
  builder.ptr = (ExtendInfo *)0x22a782;
  builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
                &DAT_00000018;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&defineText,(StringTree *)&builder,params_1_00);
  sVar4 = defineText.text.content.size_;
  pcVar25 = defineText.text.content.ptr;
  defineText.size_ = brandInitializers.scopes.size_;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         defineText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,
                        defineText.text.content.disposer._0_4_),pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = defineText.branches.size_;
  pBVar6 = defineText.branches.ptr;
  defineText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  defineText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  defineText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
  defineText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar6,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  defineText.branches.ptr = brandInitializers.scopes.branches.ptr;
  defineText.branches.size_ = brandInitializers.scopes.branches.size_;
  defineText.branches.disposer = brandInitializers.scopes.branches.disposer;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  bVar16 = TemplateContext::hasParams((TemplateContext *)nestedTypeDecls.size_);
  local_3c0 = "";
  if (bVar16) {
    local_3c0 = "  ";
  }
  suffix_00.content.size_ = 1;
  suffix_00.content.ptr = "";
  TemplateContext::decl(&local_148,(TemplateContext *)nestedTypeDecls.size_,true,suffix_00);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_3c0,(char **)&local_148,
             (StringTree *)"  struct ",(char (*) [10])&name_local,(StringPtr *)0x22b124,
             (char (*) [3])builder.ptr);
  TemplateContext::parentDecls(&local_180,(TemplateContext *)nestedTypeDecls.size_);
  suffix_01.content.size_ = 1;
  suffix_01.content.ptr = "";
  TemplateContext::decl
            (&local_1b8,(TemplateContext *)nestedTypeDecls.size_,scope_local.content.size_ < 2,
             suffix_01);
  result_4.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(size_t)((nestedTypeDecls.ptr)->text).content.ptr,
                            (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_4.ptr;
  if (((nestedTypeDecls.ptr)->text).content.ptr != (char *)0x0) {
    psVar26 = (size_t *)(nestedTypeDecls.ptr)->size_;
    do {
      pcVar25 = (char *)psVar26[1];
      sVar4 = psVar26[2];
      pAVar5 = (ArrayDisposer *)psVar26[3];
      pBVar6 = (Branch *)psVar26[4];
      sVar7 = psVar26[5];
      psVar26[1] = 0;
      psVar26[2] = 0;
      pAVar3 = (ArrayDisposer *)psVar26[6];
      psVar26[4] = 0;
      psVar26[5] = 0;
      pSVar28->size_ = *psVar26;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar4;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar6;
      (pSVar28->branches).size_ = sVar7;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      psVar26 = psVar26 + 7;
    } while (psVar26 !=
             (size_t *)
             ((long)((nestedTypeDecls.ptr)->text).content.ptr * 0x38 + (nestedTypeDecls.ptr)->size_)
            );
  }
  result_4.size_ = ((long)pSVar28 - (long)result_4.ptr >> 3) * 0x6db6db6db6db6db7;
  result_4.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[87],kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[6]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_180,&local_1b8,
             (StringTree *)0x22a396,(char (*) [8])&scope_local,&name_local,(StringPtr *)0x22aec0,
             (char (*) [4])0x229c0c,(char (*) [3])&name_local,
             (StringPtr *)
             "() = delete;\n\n#if !CAPNP_LITE\n  class Client;\n  class Server;\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [87])&result_4,(Array<kj::StringTree> *)0x22a50e,(char (*) [2])&declareText,
             (StringTree *)0x22b8fe,(char (*) [6])builder.ptr);
  TemplateContext::allDecls(&local_1f0,(TemplateContext *)nestedTypeDecls.size_);
  pacVar30 = (char (*) [9])0x0;
  result_2.ptr = (ExtendInfo *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar34,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  result_2.disposer = (ArrayDisposer *)((long)result_2.ptr + lVar33 * 0x1c71c71c71c71c78);
  result_2.size_ = (size_t)result_2.ptr;
  if (sVar34 != 0) {
    lVar38 = lVar33 * 8;
    pEVar21 = firstElement_00;
    pRVar15 = builder.pos;
    pEVar23 = builder.endPtr;
    do {
      builder.endPtr = pEVar23;
      builder.pos = pRVar15;
      kj::StringTree::flatten(&result_3,(StringTree *)pEVar21);
      brandInitializers.scopes.size_ = result_3.content.size_ - 1;
      if (result_3.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = result_3.content.ptr;
      brandInitializers.scopes.text.content.size_ = result_3.content.size_;
      brandInitializers.scopes.text.content.disposer = result_3.content.disposer;
      result_3.content.ptr = (char *)0x0;
      result_3.content.size_ = 0;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
                ((StringTree *)&builder,(kj *)",\n      public virtual ",
                 (char (*) [24])&brandInitializers,(StringTree *)0x22bff3,pacVar30);
      pacVar31 = (char (*) [9])brandInitializers.scopes.branches.size_;
      pBVar6 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar6,0x40,pacVar31,pacVar31,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pacVar30 = pacVar31;
      }
      pacVar31 = (char (*) [9])brandInitializers.scopes.text.content.size_;
      pcVar25 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar25,1,pacVar31,pacVar31,0);
        pacVar30 = pacVar31;
      }
      *(ExtendInfo **)result_2.size_ = builder.ptr;
      *(RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> **)(result_2.size_ + 8)
           = builder.pos;
      *(ExtendInfo **)(result_2.size_ + 0x10) = builder.endPtr;
      *(ArrayDisposer **)(result_2.size_ + 0x18) = builder.disposer;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pRVar15 = builder.pos;
      builder.endPtr = (ExtendInfo *)0x0;
      pEVar23 = builder.endPtr;
      *(Branch **)(result_2.size_ + 0x20) = local_a58;
      *(size_t *)(result_2.size_ + 0x28) = sStack_a50;
      *(ArrayDisposer **)(result_2.size_ + 0x30) = local_a48;
      local_a58 = (Branch *)0x0;
      sStack_a50 = 0;
      result_2.size_ = result_2.size_ + 0x38;
      builder.endPtr = (ExtendInfo *)0x0;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pEVar21 = pEVar21 + 1;
      lVar38 = lVar38 + -0x48;
    } while (lVar38 != 0);
  }
  result_5.size_ = ((long)(result_2.size_ - (long)result_2.ptr) >> 3) * 0x6db6db6db6db6db7;
  result_5.ptr = (StringTree *)result_2.ptr;
  result_5.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_448 = 0;
  uStack_440 = 0;
  local_438 = (undefined8 *)0x0;
  type.content.size_ = (size_t)&local_448;
  type.content.ptr = (char *)name_local.content.size_;
  makeAsGenericDef(&local_228,(CapnpcCppMain *)0x2,(AsGenericRole)nestedTypeDecls.size_,
                   (TemplateContext *)name_local.content.ptr,type,(String *)builder.ptr);
  result_6.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_6.ptr;
  if (sVar18 != 0) {
    pEVar23 = firstElement;
    do {
      sVar4 = (pEVar23->typeName).name.size_;
      pcVar25 = (pEVar23->typeName).name.text.content.ptr;
      sVar7 = (pEVar23->typeName).name.text.content.size_;
      pAVar5 = (pEVar23->typeName).name.text.content.disposer;
      pBVar6 = (pEVar23->typeName).name.branches.ptr;
      sVar8 = (pEVar23->typeName).name.branches.size_;
      (pEVar23->typeName).name.text.content.ptr = (char *)0x0;
      (pEVar23->typeName).name.text.content.size_ = 0;
      pAVar3 = (pEVar23->typeName).name.branches.disposer;
      (pEVar23->typeName).name.branches.ptr = (Branch *)0x0;
      (pEVar23->typeName).name.branches.size_ = 0;
      pSVar28->size_ = sVar4;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar7;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar6;
      (pSVar28->branches).size_ = sVar8;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      pEVar23 = (ExtendInfo *)&pEVar23[3].id;
    } while (pEVar23 != (ExtendInfo *)(&(firstElement->typeName).name.size_ + lVar35));
  }
  result_6.size_ = ((long)pSVar28 - (long)result_6.ptr >> 3) * 0x6db6db6db6db6db7;
  result_6.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  TemplateContext::allDecls(&local_260,(TemplateContext *)nestedTypeDecls.size_);
  pacVar30 = (char (*) [9])0x0;
  result_2.ptr = (ExtendInfo *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar34,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  result_2.disposer = (ArrayDisposer *)(lVar33 * 0x1c71c71c71c71c78 + (long)result_2.ptr);
  result_2.size_ = (size_t)result_2.ptr;
  if (sVar34 != 0) {
    lVar33 = lVar33 * 8;
    pEVar21 = firstElement_00;
    pRVar15 = builder.pos;
    pEVar23 = builder.endPtr;
    do {
      builder.endPtr = pEVar23;
      builder.pos = pRVar15;
      kj::StringTree::flatten(&result_3,(StringTree *)pEVar21);
      brandInitializers.scopes.size_ = result_3.content.size_ - 1;
      if (result_3.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = result_3.content.ptr;
      brandInitializers.scopes.text.content.size_ = result_3.content.size_;
      brandInitializers.scopes.text.content.disposer = result_3.content.disposer;
      result_3.content.ptr = (char *)0x0;
      result_3.content.size_ = 0;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
                ((StringTree *)&builder,(kj *)",\n      public virtual ",
                 (char (*) [24])&brandInitializers,(StringTree *)0x22c26c,pacVar30);
      pacVar31 = (char (*) [9])brandInitializers.scopes.branches.size_;
      pBVar6 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar6,0x40,pacVar31,pacVar31,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pacVar30 = pacVar31;
      }
      pacVar31 = (char (*) [9])brandInitializers.scopes.text.content.size_;
      pcVar25 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar25,1,pacVar31,pacVar31,0);
        pacVar30 = pacVar31;
      }
      *(ExtendInfo **)result_2.size_ = builder.ptr;
      *(RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> **)(result_2.size_ + 8)
           = builder.pos;
      *(ExtendInfo **)(result_2.size_ + 0x10) = builder.endPtr;
      *(ArrayDisposer **)(result_2.size_ + 0x18) = builder.disposer;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pRVar15 = builder.pos;
      builder.endPtr = (ExtendInfo *)0x0;
      pEVar23 = builder.endPtr;
      *(Branch **)(result_2.size_ + 0x20) = local_a58;
      *(size_t *)(result_2.size_ + 0x28) = sStack_a50;
      *(ArrayDisposer **)(result_2.size_ + 0x30) = local_a48;
      local_a58 = (Branch *)0x0;
      sStack_a50 = 0;
      result_2.size_ = result_2.size_ + 0x38;
      builder.endPtr = (ExtendInfo *)0x0;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pEVar21 = pEVar21 + 1;
      lVar33 = lVar33 + -0x48;
    } while (lVar33 != 0);
  }
  sVar4 = sStack_a50;
  pBVar6 = local_a58;
  result_7.size_ = ((long)(result_2.size_ - (long)result_2.ptr) >> 3) * 0x6db6db6db6db6db7;
  result_7.ptr = (StringTree *)result_2.ptr;
  result_7.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result_8.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_8.ptr;
  if (sVar18 != 0) {
    lVar33 = 0;
    do {
      pbVar1 = &(firstElement->typeName).isArgDependent + lVar33;
      sVar7 = *(size_t *)pbVar1;
      pcVar25 = *(char **)(pbVar1 + 8);
      psVar26 = (size_t *)((long)&firstElement[1].typeName.name.size_ + lVar33);
      sVar8 = *psVar26;
      pAVar5 = (ArrayDisposer *)psVar26[1];
      puVar2 = (undefined8 *)((long)&firstElement[1].typeName.name.text.content.size_ + lVar33);
      pBVar9 = (Branch *)*puVar2;
      sVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&firstElement->id + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pAVar3 = *(ArrayDisposer **)((long)&firstElement[1].typeName.name.branches.ptr + lVar33);
      puVar2 = (undefined8 *)((long)&firstElement[1].typeName.name.text.content.size_ + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pSVar28->size_ = sVar7;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar8;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar9;
      (pSVar28->branches).size_ = sVar10;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar35 * 8 - lVar33 != 0);
  }
  result_8.size_ = ((long)pSVar28 - (long)result_8.ptr >> 3) * 0x6db6db6db6db6db7;
  result_8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_298.size_ = 0x229c8c;
  local_298.text.content.ptr = &DAT_00000010;
  local_2d0.size_ = 0x22a19c;
  local_2d0.text.content.ptr = (char *)0x6;
  local_308.text.content.ptr = (char *)0x0;
  if (fullName.content.size_ != 0) {
    local_308.text.content.ptr = (char *)(fullName.content.size_ - 1);
  }
  local_508.size_ = 0x22bfc2;
  local_508.text.content.ptr = (char *)0x39;
  delim.content.size_ = 1;
  delim.content.ptr = "";
  kj::StringTree::StringTree(&brandInitializers.scopes,&result_5,delim);
  result_12.ptr = (StringTree *)0x22bd0d;
  result_12.size_ = 0x15;
  builder_3.pos = (RemoveConst<kj::StringTree> *)(name_local.content.size_ - 1);
  builder_3.ptr = (StringTree *)name_local.content.ptr;
  local_3e0 = (undefined1  [8])0x22bffc;
  local_3d8 = (ArrayDisposer *)0x12;
  local_6f8.content.size_ = name_local.content.size_ - 1;
  local_6f8.content.ptr = name_local.content.ptr;
  result_9.ptr = (StringTree *)anon_var_dwarf_82b39;
  result_9.size_ = 0x204;
  delim_00.content.size_ = 1;
  delim_00.content.ptr = "";
  kj::StringTree::StringTree((StringTree *)&builder,&result_6,delim_00);
  result_10.ptr = (StringTree *)anon_var_dwarf_82b52;
  result_10.size_ = 0x26;
  result_11.ptr = (StringTree *)0x22a19c;
  result_11.size_ = 6;
  local_540 = (ArrayDisposer *)0x0;
  if (fullName.content.size_ != 0) {
    local_540 = (ArrayDisposer *)(fullName.content.size_ - 1);
  }
  local_558._0_8_ = "::Server\n    : public virtual ::capnp::Capability::Server";
  local_558._8_8_ = (ArrayDisposer *)0x39;
  delim_01.content.size_ = 1;
  delim_01.content.ptr = "";
  kj::StringTree::StringTree((StringTree *)&result_2,&result_7,delim_01);
  local_568._0_8_ = " {\npublic:\n";
  local_568._8_8_ = (char *)0xb;
  local_588._16_8_ = "  typedef ";
  local_570 = (ArrayDisposer *)0xa;
  local_588._8_8_ = name_local.content.size_ - 1;
  local_588._0_8_ = name_local.content.ptr;
  local_5a8._16_8_ =
       " Serves;\n\n  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n      override;\n\nprotected:\n"
  ;
  local_590 = (CppTypeName *)0xc1;
  delim_02.content.size_ = 1;
  delim_02.content.ptr = "";
  kj::StringTree::StringTree((StringTree *)&result_3,&result_8,delim_02);
  local_5a8._0_8_ = "\n  inline ";
  local_5a8._8_8_ = (ArrayDisposer *)0xa;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_488,(kj *)&clientName,value);
  local_5b8._0_8_ =
       " thisCap() {\n    return ::capnp::Capability::Server::thisCap()\n        .template castAs<";
  local_5b8._8_8_ = (char *)0x58;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_4c8,(kj *)&typeName,value_00);
  local_3b8.content.ptr =
       ">();\n  }\n\n  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n};\n#endif  // !CAPNP_LITE\n\n"
  ;
  local_3b8.content.size_ = 0xb3;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->clientServerDefs,&local_298,(ArrayPtr<const_char> *)&local_1f0
             ,&local_2d0,(ArrayPtr<const_char> *)&local_308,(ArrayPtr<const_char> *)&local_508,
             (ArrayPtr<const_char> *)&brandInitializers,(StringTree *)&result_12,
             (ArrayPtr<const_char> *)&builder_3,(ArrayPtr<const_char> *)local_3e0,
             (ArrayPtr<const_char> *)&local_6f8,(ArrayPtr<const_char> *)&result_9,
             (ArrayPtr<const_char> *)&local_228,(StringTree *)&builder,(StringTree *)&result_10,
             (ArrayPtr<const_char> *)&local_260,(StringTree *)&result_11,
             (ArrayPtr<const_char> *)(local_558 + 0x10),(ArrayPtr<const_char> *)local_558,
             (ArrayPtr<const_char> *)&result_2,(StringTree *)local_568,
             (ArrayPtr<const_char> *)(local_588 + 0x10),(ArrayPtr<const_char> *)local_588,
             (ArrayPtr<const_char> *)(local_5a8 + 0x10),(ArrayPtr<const_char> *)&result_3,
             (StringTree *)local_5a8,(ArrayPtr<const_char> *)&local_488,(String *)local_5b8,
             (ArrayPtr<const_char> *)&local_4c8,&local_3b8,(ArrayPtr<const_char> *)builder.ptr);
  sVar7 = local_4c8.size_;
  if (local_4c8.size_ != 0) {
    local_4c8.size_ = 0;
    local_4c8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_4c8.text.content.size_)(local_4c8.text.content.size_,sVar7,1);
  }
  sVar7 = local_488.size_;
  if (local_488.size_ != 0) {
    local_488.size_ = 0;
    local_488.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_488.text.content.size_)(local_488.text.content.size_,sVar7,1);
  }
  if (local_818 != (Branch *)0x0) {
    local_818 = (Branch *)0x0;
    sStack_810 = 0;
    (**local_808->_vptr_ArrayDisposer)(local_808,pBVar13,0x40);
  }
  sVar7 = result_3.content.size_;
  if (result_3.content.size_ != 0) {
    result_3.content.size_ = 0;
    result_3.content.disposer = (ArrayDisposer *)0x0;
    (**local_820->_vptr_ArrayDisposer)(local_820,sVar7,1);
  }
  if (local_a18 != (Branch *)0x0) {
    local_a18 = (Branch *)0x0;
    pEStack_a10 = (ExtendInfo *)0x0;
    (**local_a08->_vptr_ArrayDisposer)(local_a08,pBVar11,0x40);
  }
  pAVar3 = result_2.disposer;
  sVar7 = result_2.size_;
  if (result_2.size_ != 0) {
    result_2.size_ = 0;
    result_2.disposer = (ArrayDisposer *)0x0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,(void *)sVar7,1,
               (size_t)pAVar3,(size_t)pAVar3,(_func_void_void_ptr *)0x0);
  }
  if (local_a58 != (Branch *)0x0) {
    local_a58 = (Branch *)0x0;
    sStack_a50 = 0;
    (**local_a48->_vptr_ArrayDisposer)
              (local_a48,pBVar6,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pEVar23 = builder.endPtr;
  pRVar15 = builder.pos;
  if (builder.pos != (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0) {
    builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
    builder.endPtr = (ExtendInfo *)0x0;
    (**(builder.disposer)->_vptr_ArrayDisposer)(builder.disposer,pRVar15,1,pEVar23,pEVar23,0);
  }
  sVar4 = brandInitializers.scopes.branches.size_;
  pBVar11 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  TemplateContext::allDecls((StringTree *)&result_2,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls((StringTree *)&result_3,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_488,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_4c8,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_298,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_2d0,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_308,(TemplateContext *)nestedTypeDecls.size_);
  result_9.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_9.ptr;
  if (sVar18 != 0) {
    lVar33 = 0;
    do {
      psVar26 = (size_t *)((long)&firstElement[1].typeName.name.branches.size_ + lVar33);
      sVar4 = *psVar26;
      pcVar25 = (char *)psVar26[1];
      pbVar1 = &firstElement[1].typeName.isArgDependent + lVar33;
      sVar7 = *(size_t *)pbVar1;
      pAVar5 = *(ArrayDisposer **)(pbVar1 + 8);
      puVar2 = (undefined8 *)((long)&firstElement[2].typeName.name.size_ + lVar33);
      pBVar11 = (Branch *)*puVar2;
      sVar8 = puVar2[1];
      puVar2 = (undefined8 *)((long)&firstElement[1].typeName.name.branches.disposer + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pAVar3 = *(ArrayDisposer **)((long)&firstElement[2].typeName.name.text.content.size_ + lVar33)
      ;
      puVar2 = (undefined8 *)((long)&firstElement[2].typeName.name.size_ + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pSVar28->size_ = sVar4;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar7;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar11;
      (pSVar28->branches).size_ = sVar8;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar35 * 8 - lVar33 != 0);
  }
  result_9.size_ = ((long)pSVar28 - (long)result_9.ptr >> 3) * 0x6db6db6db6db6db7;
  result_9.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result_12.ptr = (StringTree *)0x229c8c;
  result_12.size_ = 0x10;
  builder_3.pos = (RemoveConst<kj::StringTree> *)0x7;
  builder_3.ptr = (StringTree *)0x22c538;
  result_11.size_ = (size_t)(CppTypeName *)0x0;
  if (fullName.content.size_ != 0) {
    result_11.size_ = (size_t)(fullName.content.size_ - 1);
  }
  local_6f8.content.size_ = 0x52;
  local_6f8.content.ptr =
       "::Client::Client(decltype(nullptr))\n    : ::capnp::Capability::Client(nullptr) {}\n";
  result_10.ptr = (StringTree *)0x22c538;
  result_10.size_ = 7;
  local_558._16_8_ =
       "::Client::Client(\n    ::kj::Own< ::capnp::ClientHook>&& hook)\n    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n"
  ;
  local_540 = (ArrayDisposer *)0x73;
  local_558._0_8_ = "template <typename _t, typename>\ninline ";
  local_558._8_8_ = &DAT_00000028;
  local_588._16_8_ =
       "::Client::Client(::kj::Own<_t>&& server)\n    : ::capnp::Capability::Client(::kj::mv(server)) {}\n"
  ;
  local_570 = (ArrayDisposer *)0x60;
  local_588._0_8_ = "template <typename _t, typename>\ninline ";
  local_588._8_8_ = &DAT_00000028;
  local_5a8._0_8_ =
       "::Client::Client(::kj::Promise<_t>&& promise)\n    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n"
  ;
  local_5a8._8_8_ = (ArrayDisposer *)0x66;
  local_5b8._0_8_ = "inline ";
  local_5b8._8_8_ = (char *)0x7;
  local_318.ptr =
       "::Client::Client(::kj::Exception&& exception)\n    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n"
  ;
  local_318.size_ = 0x68;
  local_338._16_8_ = "inline ";
  local_320 = 7;
  local_590 = (CppTypeName *)result_11.size_;
  local_568._8_8_ = result_11.size_;
  local_3d8 = (ArrayDisposer *)result_11.size_;
  local_3b8.content.size_ = result_11.size_;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&builder,(kj *)&clientName,(CppTypeName *)result_11.size_);
  local_338._0_8_ = "& ";
  local_338._8_8_ = 2;
  local_348.size_ = (size_t)(CppTypeName *)0x0;
  if (fullName.content.size_ != 0) {
    local_348.size_ = (size_t)(fullName.content.size_ - 1);
  }
  local_358.ptr =
       "::Client::operator=(Client& other) {\n  ::capnp::Capability::Client::operator=(other);\n  return *this;\n}\n"
  ;
  local_358.size_ = 0x68;
  local_378._16_8_ = "inline ";
  local_360 = 7;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_508,(kj *)&clientName,(CppTypeName *)local_348.size_);
  local_378._0_8_ = "& ";
  local_378._8_8_ = 2;
  local_388.size_ = (size_t)(ArrayDisposer *)0x0;
  if (fullName.content.size_ != 0) {
    local_388.size_ = (size_t)(fullName.content.size_ - 1);
  }
  local_398.ptr =
       "::Client::operator=(Client&& other) {\n  ::capnp::Capability::Client::operator=(kj::mv(other));\n  return *this;\n}\n\n"
  ;
  local_398.size_ = 0x72;
  delim_03.content.size_ = 1;
  delim_03.content.ptr = "";
  kj::StringTree::StringTree(&brandInitializers.scopes,&result_9,delim_03);
  local_f0._0_8_ = "#endif  // !CAPNP_LITE\n";
  local_f0._8_8_ = (char *)0x17;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->inlineMethodDefs,(StringTree *)&result_12,
             (ArrayPtr<const_char> *)&result_2,(StringTree *)&builder_3,
             (ArrayPtr<const_char> *)local_3e0,(ArrayPtr<const_char> *)&local_6f8,
             (ArrayPtr<const_char> *)&result_3,(StringTree *)&result_10,
             (ArrayPtr<const_char> *)&result_11,(ArrayPtr<const_char> *)(local_558 + 0x10),
             (ArrayPtr<const_char> *)&local_488,(StringTree *)local_558,
             (ArrayPtr<const_char> *)local_568,(ArrayPtr<const_char> *)(local_588 + 0x10),
             (ArrayPtr<const_char> *)&local_4c8,(StringTree *)local_588,
             (ArrayPtr<const_char> *)(local_5a8 + 0x10),(ArrayPtr<const_char> *)local_5a8,
             (ArrayPtr<const_char> *)&local_298,(StringTree *)local_5b8,
             (ArrayPtr<const_char> *)&local_3b8,&local_318,(ArrayPtr<const_char> *)&local_2d0,
             (StringTree *)(local_338 + 0x10),(ArrayPtr<const_char> *)&builder,(String *)local_338,
             &local_348,&local_358,(ArrayPtr<const_char> *)&local_308,
             (StringTree *)(local_378 + 0x10),(ArrayPtr<const_char> *)&local_508,(String *)local_378
             ,&local_388,&local_398,(ArrayPtr<const_char> *)&brandInitializers,
             (StringTree *)local_f0,(ArrayPtr<const_char> *)builder.ptr);
  sVar4 = brandInitializers.scopes.branches.size_;
  pBVar11 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  pcVar25 = local_508.text.content.ptr;
  sVar4 = local_508.size_;
  if ((char *)local_508.size_ != (char *)0x0) {
    local_508.size_ = 0;
    local_508.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_508.text.content.size_)
              (local_508.text.content.size_,sVar4,1,pcVar25,pcVar25,0);
  }
  pRVar15 = builder.pos;
  pEVar23 = builder.ptr;
  if (builder.ptr != (ExtendInfo *)0x0) {
    builder.ptr = (ExtendInfo *)0x0;
    builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
    (**(code **)((builder.endPtr)->typeName).name.size_)(builder.endPtr,pEVar23,1,pRVar15,pRVar15,0)
    ;
  }
  result_10.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_10.ptr;
  if (sVar18 != 0) {
    lVar33 = 0;
    do {
      psVar26 = (size_t *)((long)&firstElement[2].typeName.name.text.content.disposer + lVar33);
      sVar4 = *psVar26;
      pcVar25 = (char *)psVar26[1];
      psVar26 = (size_t *)((long)&firstElement[2].typeName.name.branches.size_ + lVar33);
      sVar7 = *psVar26;
      pAVar5 = (ArrayDisposer *)psVar26[1];
      pbVar1 = &firstElement[2].typeName.isArgDependent + lVar33;
      pBVar11 = *(Branch **)pbVar1;
      sVar8 = *(size_t *)(pbVar1 + 8);
      puVar2 = (undefined8 *)((long)&firstElement[2].typeName.name.branches.ptr + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pAVar3 = *(ArrayDisposer **)((long)&firstElement[3].typeName.name.size_ + lVar33);
      pbVar1 = &firstElement[2].typeName.isArgDependent + lVar33;
      *(undefined8 *)pbVar1 = 0;
      *(undefined8 *)(pbVar1 + 8) = 0;
      pSVar28->size_ = sVar4;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar7;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar11;
      (pSVar28->branches).size_ = sVar8;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar35 * 8 - lVar33 != 0);
  }
  result_10.size_ = ((long)pSVar28 - (long)result_10.ptr >> 3) * 0x6db6db6db6db6db7;
  result_10.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  TemplateContext::allDecls(&local_508,(TemplateContext *)nestedTypeDecls.size_);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)local_3e0,uVar27);
  builder_3.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar37,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  builder_3.endPtr = (StringTree *)(lVar36 * 0x1c71c71c71c71c78 + (long)builder_3.ptr);
  builder_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder_3.pos = builder_3.ptr;
  if (sVar37 != 0) {
    lVar36 = lVar36 * 8;
    pEVar21 = pEVar32;
    pRVar15 = builder.pos;
    pEVar23 = builder.endPtr;
    do {
      builder.endPtr = pEVar23;
      builder.pos = pRVar15;
      kj::hex((CappedArray<char,_17UL> *)&result_12,pEVar21->id);
      kj::StringTree::flatten(&local_6f8,(StringTree *)pEVar21);
      brandInitializers.scopes.size_ = local_6f8.content.size_ - 1;
      if (local_6f8.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = local_6f8.content.ptr;
      brandInitializers.scopes.text.content.size_ = local_6f8.content.size_;
      brandInitializers.scopes.text.content.disposer = local_6f8.content.disposer;
      local_6f8.content._0_16_ = ZEXT816(0);
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::
      strTree<char_const(&)[12],kj::CappedArray<char,17ul>,char_const(&)[19],kj::StringTree,char_const(&)[52]>
                ((StringTree *)&builder,(kj *)0x22c7fd,(char (*) [12])&result_12,
                 (CappedArray<char,_17UL> *)"ull:\n      return ",(char (*) [19])&brandInitializers,
                 (StringTree *)"::Server::dispatchCallInternal(methodId, context);\n",
                 (char (*) [52])builder.ptr);
      sVar4 = brandInitializers.scopes.branches.size_;
      pBVar11 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar11,0x40,sVar4,sVar4,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar4 = brandInitializers.scopes.text.content.size_;
      pcVar25 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
      }
      (builder_3.pos)->size_ = (size_t)builder.ptr;
      ((builder_3.pos)->text).content.ptr = (char *)builder.pos;
      ((builder_3.pos)->text).content.size_ = (size_t)builder.endPtr;
      ((builder_3.pos)->text).content.disposer = builder.disposer;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pRVar15 = builder.pos;
      builder.endPtr = (ExtendInfo *)0x0;
      pEVar23 = builder.endPtr;
      ((builder_3.pos)->branches).ptr = local_a58;
      ((builder_3.pos)->branches).size_ = sStack_a50;
      ((builder_3.pos)->branches).disposer = local_a48;
      local_a58 = (Branch *)0x0;
      sStack_a50 = 0;
      builder_3.pos = builder_3.pos + 1;
      builder.endPtr = (ExtendInfo *)0x0;
      builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
      pEVar21 = pEVar21 + 1;
      lVar36 = lVar36 + -0x48;
    } while (lVar36 != 0);
  }
  result_11.size_ = ((long)builder_3.pos - (long)builder_3.ptr >> 3) * 0x6db6db6db6db6db7;
  result_11.ptr = builder_3.ptr;
  result_11.disposer = builder_3.disposer;
  brandInitializers.scopes.text.content.ptr = (char *)proto._reader.capTable;
  brandInitializers.scopes.text.content.size_ = (size_t)proto._reader.pointers;
  brandInitializers.scopes.size_ = (size_t)proto._reader.segment;
  iVar17 = proto._reader.nestingLimit;
  if (proto._reader.pointerCount == 0) {
    brandInitializers.scopes.text.content.ptr = (char *)(CapTableReader *)0x0;
    brandInitializers.scopes.text.content.size_ = (size_t)(WirePointer *)0x0;
    brandInitializers.scopes.size_ = (size_t)(SegmentReader *)0x0;
    iVar17 = 0x7fffffff;
  }
  brandInitializers.scopes.text.content.disposer =
       (ArrayDisposer *)CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,iVar17);
  builder_3._0_16_ =
       _::PointerReader::getBlob<capnp::Text>((PointerReader *)&brandInitializers,(void *)0x0,0);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  result_12.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar28 = result_12.ptr;
  if (sVar18 != 0) {
    lVar33 = 0;
    do {
      psVar26 = (size_t *)((long)&firstElement[3].typeName.name.text.content.ptr + lVar33);
      sVar4 = *psVar26;
      pcVar25 = (char *)psVar26[1];
      psVar26 = (size_t *)((long)&firstElement[3].typeName.name.text.content.disposer + lVar33);
      sVar7 = *psVar26;
      pAVar5 = (ArrayDisposer *)psVar26[1];
      puVar2 = (undefined8 *)((long)&firstElement[3].typeName.name.branches.size_ + lVar33);
      pBVar11 = (Branch *)*puVar2;
      sVar8 = puVar2[1];
      puVar2 = (undefined8 *)((long)&firstElement[3].typeName.name.text.content.size_ + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pAVar3 = *(ArrayDisposer **)(&firstElement[3].typeName.isArgDependent + lVar33);
      puVar2 = (undefined8 *)((long)&firstElement[3].typeName.name.branches.size_ + lVar33);
      *puVar2 = 0;
      puVar2[1] = 0;
      pSVar28->size_ = sVar4;
      (pSVar28->text).content.ptr = pcVar25;
      (pSVar28->text).content.size_ = sVar7;
      (pSVar28->text).content.disposer = pAVar5;
      (pSVar28->branches).ptr = pBVar11;
      (pSVar28->branches).size_ = sVar8;
      (pSVar28->branches).disposer = pAVar3;
      pSVar28 = pSVar28 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar35 * 8 - lVar33 != 0);
  }
  result_12.size_ = ((long)pSVar28 - (long)result_12.ptr >> 3) * 0x6db6db6db6db6db7;
  result_12.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  if (proto._reader.pointerCount == 0) {
    proto._reader.nestingLimit = 0x7fffffff;
    proto._reader.capTable = (CapTableReader *)0x0;
    proto._reader.pointers = (WirePointer *)0x0;
    proto._reader.segment = (SegmentReader *)0x0;
  }
  builder.disposer = (ArrayDisposer *)CONCAT44(builder.disposer._4_4_,proto._reader.nestingLimit);
  builder.ptr = (ExtendInfo *)proto._reader.segment;
  builder.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
                proto._reader.capTable;
  builder.endPtr = (ExtendInfo *)proto._reader.pointers;
  local_6f8.content._0_16_ =
       _::PointerReader::getBlob<capnp::Text>((PointerReader *)&builder,(void *)0x0,0);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)&builder,uVar27);
  kj::
  strTree<char_const(&)[17],kj::Array<kj::StringTree>,kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[185],kj::CappedArray<char,17ul>,char_const(&)[60],kj::Array<kj::StringTree>,char_const(&)[50],capnp::Text::Reader,char_const(&)[24],kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[157],kj::Array<kj::StringTree>,char_const(&)[111],capnp::Text::Reader,char_const(&)[16],kj::CappedArray<char,17ul>,char_const(&)[47],kj::StringTree>
            (&__return_storage_ptr__->sourceDefs,(kj *)0x229c8c,(char (*) [17])&result_10,
             (Array<kj::StringTree> *)&local_508,(StringTree *)0x22cb06,(char (*) [21])&fullName,
             (String *)
             "::Server::dispatchCall(\n    uint64_t interfaceId, uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (interfaceId) {\n    case 0x"
             ,(char (*) [185])local_3e0,
             (CappedArray<char,_17UL> *)
             "ull:\n      return dispatchCallInternal(methodId, context);\n",
             (char (*) [60])&result_11,
             (Array<kj::StringTree> *)"    default:\n      return internalUnimplemented(\"",
             (char (*) [50])&builder_3,(Reader *)"\", interfaceId);\n  }\n}\n",
             (char (*) [24])&brandInitializers,(StringTree *)0x22cb06,(char (*) [21])&fullName,
             (String *)
             "::Server::dispatchCallInternal(\n    uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (methodId) {\n"
             ,(char (*) [157])&result_12,
             (Array<kj::StringTree> *)
             "    default:\n      (void)context;\n      return ::capnp::Capability::Server::internalUnimplemented(\n          \""
             ,(char (*) [111])&local_6f8,(Reader *)"\",\n          0x",(char (*) [16])&builder,
             (CappedArray<char,_17UL> *)"ull, methodId);\n  }\n}\n#endif  // !CAPNP_LITE\n\n",
             (char (*) [47])&defineText,(StringTree *)builder.ptr);
  sVar4 = result_12.size_;
  pSVar28 = result_12.ptr;
  if (result_12.ptr != (StringTree *)0x0) {
    result_12.ptr = (StringTree *)0x0;
    result_12.size_ = 0;
    (**(result_12.disposer)->_vptr_ArrayDisposer)(result_12.disposer,pSVar28,0x38,sVar4,sVar4);
  }
  sVar4 = brandInitializers.scopes.branches.size_;
  pBVar11 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = brandInitializers.scopes.text.content.size_;
  pcVar25 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = result_11.size_;
  pSVar28 = result_11.ptr;
  if (result_11.ptr != (StringTree *)0x0) {
    result_11.ptr = (StringTree *)0x0;
    result_11.size_ = 0;
    (**(result_11.disposer)->_vptr_ArrayDisposer)(result_11.disposer,pSVar28,0x38,sVar4,sVar4);
  }
  sVar4 = local_508.branches.size_;
  pBVar11 = local_508.branches.ptr;
  if (local_508.branches.ptr != (Branch *)0x0) {
    local_508.branches.ptr = (Branch *)0x0;
    local_508.branches.size_ = 0;
    (**(local_508.branches.disposer)->_vptr_ArrayDisposer)
              (local_508.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_508.text.content.size_;
  pcVar25 = local_508.text.content.ptr;
  if (local_508.text.content.ptr != (char *)0x0) {
    local_508.text.content.ptr = (char *)0x0;
    local_508.text.content.size_ = 0;
    (**(local_508.text.content.disposer)->_vptr_ArrayDisposer)
              (local_508.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = result_10.size_;
  pSVar28 = result_10.ptr;
  if (result_10.ptr != (StringTree *)0x0) {
    result_10.ptr = (StringTree *)0x0;
    result_10.size_ = 0;
    (**(result_10.disposer)->_vptr_ArrayDisposer)(result_10.disposer,pSVar28,0x38,sVar4,sVar4);
  }
  sVar4 = result_9.size_;
  pSVar28 = result_9.ptr;
  if (result_9.ptr != (StringTree *)0x0) {
    result_9.ptr = (StringTree *)0x0;
    result_9.size_ = 0;
    (**(result_9.disposer)->_vptr_ArrayDisposer)(result_9.disposer,pSVar28,0x38,sVar4,sVar4);
  }
  sVar4 = local_308.branches.size_;
  pBVar11 = local_308.branches.ptr;
  if (local_308.branches.ptr != (Branch *)0x0) {
    local_308.branches.ptr = (Branch *)0x0;
    local_308.branches.size_ = 0;
    (**(local_308.branches.disposer)->_vptr_ArrayDisposer)
              (local_308.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_308.text.content.size_;
  pcVar25 = local_308.text.content.ptr;
  if (local_308.text.content.ptr != (char *)0x0) {
    local_308.text.content.ptr = (char *)0x0;
    local_308.text.content.size_ = 0;
    (**(local_308.text.content.disposer)->_vptr_ArrayDisposer)
              (local_308.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = local_2d0.branches.size_;
  pBVar11 = local_2d0.branches.ptr;
  if (local_2d0.branches.ptr != (Branch *)0x0) {
    local_2d0.branches.ptr = (Branch *)0x0;
    local_2d0.branches.size_ = 0;
    (**(local_2d0.branches.disposer)->_vptr_ArrayDisposer)
              (local_2d0.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_2d0.text.content.size_;
  pcVar25 = local_2d0.text.content.ptr;
  if (local_2d0.text.content.ptr != (char *)0x0) {
    local_2d0.text.content.ptr = (char *)0x0;
    local_2d0.text.content.size_ = 0;
    (**(local_2d0.text.content.disposer)->_vptr_ArrayDisposer)
              (local_2d0.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = local_298.branches.size_;
  pBVar11 = local_298.branches.ptr;
  if (local_298.branches.ptr != (Branch *)0x0) {
    local_298.branches.ptr = (Branch *)0x0;
    local_298.branches.size_ = 0;
    (**(local_298.branches.disposer)->_vptr_ArrayDisposer)
              (local_298.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_298.text.content.size_;
  pcVar25 = local_298.text.content.ptr;
  if (local_298.text.content.ptr != (char *)0x0) {
    local_298.text.content.ptr = (char *)0x0;
    local_298.text.content.size_ = 0;
    (**(local_298.text.content.disposer)->_vptr_ArrayDisposer)
              (local_298.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = local_4c8.branches.size_;
  pBVar11 = local_4c8.branches.ptr;
  if (local_4c8.branches.ptr != (Branch *)0x0) {
    local_4c8.branches.ptr = (Branch *)0x0;
    local_4c8.branches.size_ = 0;
    (**(local_4c8.branches.disposer)->_vptr_ArrayDisposer)
              (local_4c8.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_4c8.text.content.size_;
  pcVar25 = local_4c8.text.content.ptr;
  if (local_4c8.text.content.ptr != (char *)0x0) {
    local_4c8.text.content.ptr = (char *)0x0;
    local_4c8.text.content.size_ = 0;
    (**(local_4c8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_4c8.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  sVar4 = local_488.branches.size_;
  pBVar11 = local_488.branches.ptr;
  if (local_488.branches.ptr != (Branch *)0x0) {
    local_488.branches.ptr = (Branch *)0x0;
    local_488.branches.size_ = 0;
    (**(local_488.branches.disposer)->_vptr_ArrayDisposer)
              (local_488.branches.disposer,pBVar11,0x40,sVar4,sVar4);
  }
  sVar4 = local_488.text.content.size_;
  pcVar25 = local_488.text.content.ptr;
  if (local_488.text.content.ptr != (char *)0x0) {
    local_488.text.content.ptr = (char *)0x0;
    local_488.text.content.size_ = 0;
    (**(local_488.text.content.disposer)->_vptr_ArrayDisposer)
              (local_488.text.content.disposer,pcVar25,1,sVar4,sVar4);
  }
  if (local_818 != (Branch *)0x0) {
    (**local_808->_vptr_ArrayDisposer)(local_808,local_818,0x40,sStack_810,sStack_810);
  }
  pAVar3 = result_3.content.disposer;
  sVar4 = result_3.content.size_;
  if (result_3.content.size_ != 0) {
    result_3.content.size_ = 0;
    result_3.content.disposer = (ArrayDisposer *)0x0;
    (**local_820->_vptr_ArrayDisposer)(local_820,sVar4,1,pAVar3,pAVar3);
  }
  if (local_a18 != (Branch *)0x0) {
    (**local_a08->_vptr_ArrayDisposer)(local_a08,local_a18,0x40,pEStack_a10,pEStack_a10);
  }
  pAVar3 = result_2.disposer;
  sVar4 = result_2.size_;
  if (result_2.size_ != 0) {
    result_2.size_ = 0;
    result_2.disposer = (ArrayDisposer *)0x0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,(void *)sVar4,1,
               (size_t)pAVar3,(size_t)pAVar3,(_func_void_void_ptr *)0x0);
  }
  sVar4 = result_8.size_;
  pSVar28 = result_8.ptr;
  if (result_8.ptr != (StringTree *)0x0) {
    result_8.ptr = (StringTree *)0x0;
    result_8.size_ = 0;
    (**(result_8.disposer)->_vptr_ArrayDisposer)
              (result_8.disposer,pSVar28,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar4 = result_7.size_;
  pSVar28 = result_7.ptr;
  if (result_7.ptr != (StringTree *)0x0) {
    result_7.ptr = (StringTree *)0x0;
    result_7.size_ = 0;
    (**(result_7.disposer)->_vptr_ArrayDisposer)
              (result_7.disposer,pSVar28,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar4 = local_260.branches.size_;
  pBVar11 = local_260.branches.ptr;
  if (local_260.branches.ptr != (Branch *)0x0) {
    local_260.branches.ptr = (Branch *)0x0;
    local_260.branches.size_ = 0;
    (**(local_260.branches.disposer)->_vptr_ArrayDisposer)
              (local_260.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_260.text.content.size_;
  pcVar25 = local_260.text.content.ptr;
  if (local_260.text.content.ptr != (char *)0x0) {
    local_260.text.content.ptr = (char *)0x0;
    local_260.text.content.size_ = 0;
    (**(local_260.text.content.disposer)->_vptr_ArrayDisposer)
              (local_260.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = result_6.size_;
  pSVar28 = result_6.ptr;
  if (result_6.ptr != (StringTree *)0x0) {
    result_6.ptr = (StringTree *)0x0;
    result_6.size_ = 0;
    (**(result_6.disposer)->_vptr_ArrayDisposer)
              (result_6.disposer,pSVar28,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar4 = local_228.branches.size_;
  pBVar11 = local_228.branches.ptr;
  if (local_228.branches.ptr != (Branch *)0x0) {
    local_228.branches.ptr = (Branch *)0x0;
    local_228.branches.size_ = 0;
    (**(local_228.branches.disposer)->_vptr_ArrayDisposer)
              (local_228.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_228.text.content.size_;
  pcVar25 = local_228.text.content.ptr;
  if (local_228.text.content.ptr != (char *)0x0) {
    local_228.text.content.ptr = (char *)0x0;
    local_228.text.content.size_ = 0;
    (**(local_228.text.content.disposer)->_vptr_ArrayDisposer)
              (local_228.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  uVar14 = uStack_440;
  lVar35 = local_448;
  if (local_448 != 0) {
    local_448 = 0;
    uStack_440 = 0;
    (**(code **)*local_438)(local_438,lVar35,1,uVar14,uVar14,0);
  }
  sVar4 = result_5.size_;
  pSVar28 = result_5.ptr;
  if (result_5.ptr != (StringTree *)0x0) {
    result_5.ptr = (StringTree *)0x0;
    result_5.size_ = 0;
    (**(result_5.disposer)->_vptr_ArrayDisposer)
              (result_5.disposer,pSVar28,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar4 = local_1f0.branches.size_;
  pBVar11 = local_1f0.branches.ptr;
  if (local_1f0.branches.ptr != (Branch *)0x0) {
    local_1f0.branches.ptr = (Branch *)0x0;
    local_1f0.branches.size_ = 0;
    (**(local_1f0.branches.disposer)->_vptr_ArrayDisposer)
              (local_1f0.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_1f0.text.content.size_;
  pcVar25 = local_1f0.text.content.ptr;
  if (local_1f0.text.content.ptr != (char *)0x0) {
    local_1f0.text.content.ptr = (char *)0x0;
    local_1f0.text.content.size_ = 0;
    (**(local_1f0.text.content.disposer)->_vptr_ArrayDisposer)
              (local_1f0.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = result_4.size_;
  pSVar28 = result_4.ptr;
  if (result_4.ptr != (StringTree *)0x0) {
    result_4.ptr = (StringTree *)0x0;
    result_4.size_ = 0;
    (**(result_4.disposer)->_vptr_ArrayDisposer)
              (result_4.disposer,pSVar28,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar4 = local_1b8.branches.size_;
  pBVar11 = local_1b8.branches.ptr;
  if (local_1b8.branches.ptr != (Branch *)0x0) {
    local_1b8.branches.ptr = (Branch *)0x0;
    local_1b8.branches.size_ = 0;
    (**(local_1b8.branches.disposer)->_vptr_ArrayDisposer)
              (local_1b8.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_1b8.text.content.size_;
  pcVar25 = local_1b8.text.content.ptr;
  if (local_1b8.text.content.ptr != (char *)0x0) {
    local_1b8.text.content.ptr = (char *)0x0;
    local_1b8.text.content.size_ = 0;
    (**(local_1b8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_1b8.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = local_180.branches.size_;
  pBVar11 = local_180.branches.ptr;
  if (local_180.branches.ptr != (Branch *)0x0) {
    local_180.branches.ptr = (Branch *)0x0;
    local_180.branches.size_ = 0;
    (**(local_180.branches.disposer)->_vptr_ArrayDisposer)
              (local_180.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_180.text.content.size_;
  pcVar25 = local_180.text.content.ptr;
  if (local_180.text.content.ptr != (char *)0x0) {
    local_180.text.content.ptr = (char *)0x0;
    local_180.text.content.size_ = 0;
    (**(local_180.text.content.disposer)->_vptr_ArrayDisposer)
              (local_180.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = local_148.branches.size_;
  pBVar11 = local_148.branches.ptr;
  if (local_148.branches.ptr != (Branch *)0x0) {
    local_148.branches.ptr = (Branch *)0x0;
    local_148.branches.size_ = 0;
    (**(local_148.branches.disposer)->_vptr_ArrayDisposer)
              (local_148.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_148.text.content.size_;
  pcVar25 = local_148.text.content.ptr;
  if (local_148.text.content.ptr != (char *)0x0) {
    local_148.text.content.ptr = (char *)0x0;
    local_148.text.content.size_ = 0;
    (**(local_148.text.content.disposer)->_vptr_ArrayDisposer)
              (local_148.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = defineText.branches.size_;
  pBVar11 = defineText.branches.ptr;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = defineText.text.content.size_;
  pcVar25 = defineText.text.content.ptr;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         defineText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,
                        defineText.text.content.disposer._0_4_),pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = declareText.branches.size_;
  pBVar11 = declareText.branches.ptr;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = declareText.text.content.size_;
  pcVar25 = declareText.text.content.ptr;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(declareText.text.content.disposer._4_4_,
                         declareText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(declareText.text.content.disposer._4_4_,
                        declareText.text.content.disposer._0_4_),pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = templates.content.size_;
  pcVar25 = templates.content.ptr;
  if (templates.content.ptr != (char *)0x0) {
    templates.content.ptr = (char *)0x0;
    templates.content.size_ = 0;
    (**(templates.content.disposer)->_vptr_ArrayDisposer)
              (templates.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = clientName.name.branches.size_;
  pBVar11 = clientName.name.branches.ptr;
  if (clientName.name.branches.ptr != (Branch *)0x0) {
    clientName.name.branches.ptr = (Branch *)0x0;
    clientName.name.branches.size_ = 0;
    (**(clientName.name.branches.disposer)->_vptr_ArrayDisposer)
              (clientName.name.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = clientName.name.text.content.size_;
  pcVar25 = clientName.name.text.content.ptr;
  if (clientName.name.text.content.ptr != (char *)0x0) {
    clientName.name.text.content.ptr = (char *)0x0;
    clientName.name.text.content.size_ = 0;
    (**(clientName.name.text.content.disposer)->_vptr_ArrayDisposer)
              (clientName.name.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  sVar4 = typeName.name.branches.size_;
  pBVar11 = typeName.name.branches.ptr;
  if (typeName.name.branches.ptr != (Branch *)0x0) {
    typeName.name.branches.ptr = (Branch *)0x0;
    typeName.name.branches.size_ = 0;
    (**(typeName.name.branches.disposer)->_vptr_ArrayDisposer)
              (typeName.name.branches.disposer,pBVar11,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = typeName.name.text.content.size_;
  pcVar25 = typeName.name.text.content.ptr;
  if (typeName.name.text.content.ptr != (char *)0x0) {
    typeName.name.text.content.ptr = (char *)0x0;
    typeName.name.text.content.size_ = 0;
    (**(typeName.name.text.content.disposer)->_vptr_ArrayDisposer)
              (typeName.name.text.content.disposer,pcVar25,1,sVar4,sVar4,0);
  }
  if (pEVar32 != (ExtendInfo *)0x0) {
    (**pAVar12->_vptr_ArrayDisposer)
              (pAVar12,pEVar32,0x48,sVar37,sVar37,
               kj::ArrayDisposer::
               Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo,_false>::destruct);
  }
  if (firstElement_00 != (ExtendInfo *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement_00,0x48,sVar34,
               sVar34,kj::ArrayDisposer::
                      Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo,_false>::
                      destruct);
  }
  if (firstElement != (ExtendInfo *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0x118,sVar18,
               sVar18,kj::ArrayDisposer::
                      Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText,_false>::
                      destruct);
  }
  sVar18 = fullName.content.size_;
  pcVar25 = fullName.content.ptr;
  if (fullName.content.ptr != (char *)0x0) {
    fullName.content.ptr = (char *)0x0;
    fullName.content.size_ = 0;
    (**(fullName.content.disposer)->_vptr_ArrayDisposer)
              (fullName.content.disposer,pcVar25,1,sVar18,sVar18,0);
  }
  return __return_storage_ptr__;
}

Assistant:

InterfaceText makeInterfaceText(kj::StringPtr scope, kj::StringPtr name, InterfaceSchema schema,
                                  kj::Array<kj::StringTree> nestedTypeDecls,
                                  const TemplateContext& templateContext) {
    auto fullName = kj::str(scope, name, templateContext.args());
    auto methods = KJ_MAP(m, schema.getMethods()) {
      return makeMethodText(fullName, m, templateContext);
    };

    auto proto = schema.getProto();
    auto hexId = kj::hex(proto.getId());

    auto superclasses = KJ_MAP(superclass, schema.getSuperclasses()) {
      return ExtendInfo { cppFullName(superclass, nullptr), superclass.getProto().getId() };
    };

    kj::Array<ExtendInfo> transitiveSuperclasses;
    {
      std::map<uint64_t, InterfaceSchema> map;
      getTransitiveSuperclasses(schema, map);
      map.erase(schema.getProto().getId());
      transitiveSuperclasses = KJ_MAP(entry, map) {
        return ExtendInfo { cppFullName(entry.second, nullptr), entry.second.getProto().getId() };
      };
    }

    CppTypeName typeName = cppFullName(schema, nullptr);

    CppTypeName clientName = typeName;
    clientName.addMemberType("Client");

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  #if !CAPNP_LITE\n"
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_INTERFACE_HEADER(", hexId, ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          makeGenericDeclarations(templateContext, hasDeps));

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };\n  #endif  // !CAPNP_LITE");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    return InterfaceText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "#if !CAPNP_LITE\n"
          "  class Client;\n"
          "  class Server;\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n"
          "};\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "class ", fullName, "::Client\n"
          "    : public virtual ::capnp::Capability::Client",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Client");
          }, " {\n"
          "public:\n"
          "  typedef ", name, " Calls;\n"
          "  typedef ", name, " Reads;\n"
          "\n"
          "  Client(decltype(nullptr));\n"
          "  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n"
          "  Client(::kj::Own<_t>&& server);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n"
          "  Client(::kj::Promise<_t>&& promise);\n"
          "  Client(::kj::Exception&& exception);\n"
          "  Client(Client&) = default;\n"
          "  Client(Client&&) = default;\n"
          "  Client& operator=(Client& other);\n"
          "  Client& operator=(Client&& other);\n"
          "\n",
          makeAsGenericDef(AsGenericRole::CLIENT, templateContext, name),
          KJ_MAP(m, methods) { return kj::mv(m.clientDecls); },
          "\n"
          "protected:\n"
          "  Client() = default;\n"
          "};\n"
          "\n",
          templateContext.allDecls(),
          "class ", fullName, "::Server\n"
          "    : public virtual ::capnp::Capability::Server",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Server");
          }, " {\n"
          "public:\n",
          "  typedef ", name, " Serves;\n"
          "\n"
          "  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n"
          "      override;\n"
          "\n"
          "protected:\n",
          KJ_MAP(m, methods) { return kj::mv(m.serverDecls); },
          "\n"
          "  inline ", clientName, " thisCap() {\n"
          "    return ::capnp::Capability::Server::thisCap()\n"
          "        .template castAs<", typeName, ">();\n"
          "  }\n"
          "\n"
          "  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n"
          "};\n"
          "#endif  // !CAPNP_LITE\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(decltype(nullptr))\n"
          "    : ::capnp::Capability::Client(nullptr) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(\n"
          "    ::kj::Own< ::capnp::ClientHook>&& hook)\n"
          "    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Own<_t>&& server)\n"
          "    : ::capnp::Capability::Client(::kj::mv(server)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Promise<_t>&& promise)\n"
          "    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(::kj::Exception&& exception)\n"
          "    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client& other) {\n"
          "  ::capnp::Capability::Client::operator=(other);\n"
          "  return *this;\n"
          "}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client&& other) {\n"
          "  ::capnp::Capability::Client::operator=(kj::mv(other));\n"
          "  return *this;\n"
          "}\n"
          "\n",
          KJ_MAP(m, methods) { return kj::mv(m.inlineDefs); },
          "#endif  // !CAPNP_LITE\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          KJ_MAP(m, methods) { return kj::mv(m.sourceDefs); },
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCall(\n"
          "    uint64_t interfaceId, uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (interfaceId) {\n"
          "    case 0x", kj::hex(proto.getId()), "ull:\n"
          "      return dispatchCallInternal(methodId, context);\n",
          KJ_MAP(s, transitiveSuperclasses) {
            return kj::strTree(
              "    case 0x", kj::hex(s.id), "ull:\n"
              "      return ", s.typeName.strNoTypename(),
                         "::Server::dispatchCallInternal(methodId, context);\n");
          },
          "    default:\n"
          "      return internalUnimplemented(\"", proto.getDisplayName(), "\", interfaceId);\n"
          "  }\n"
          "}\n",
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCallInternal(\n"
          "    uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (methodId) {\n",
          KJ_MAP(m, methods) { return kj::mv(m.dispatchCase); },
          "    default:\n"
          "      (void)context;\n"
          "      return ::capnp::Capability::Server::internalUnimplemented(\n"
          "          \"", proto.getDisplayName(), "\",\n"
          "          0x", kj::hex(proto.getId()), "ull, methodId);\n"
          "  }\n"
          "}\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          kj::mv(defineText))
    };
  }